

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

HFSubWorker * __thiscall
AbstractModuleClient::subscribeHighFreqData
          (AbstractModuleClient *this,string *dataName,string *originModule,
          hfs_data_callback_fn userFoo,void *args)

{
  bool bVar1;
  HFSubWorker *pHVar2;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  HighFreqDataType local_c0;
  
  std::__cxx11::string::string((string *)&local_e0,(string *)dataName);
  std::__cxx11::string::string((string *)&local_100,(string *)originModule);
  bVar1 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_e0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_120,(string *)dataName);
    std::__cxx11::string::string((string *)&local_140,(string *)originModule);
    pHVar2 = (HFSubWorker *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_120,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    if ((pHVar2->super_HighFreqSub).sockType == ST_WORKER) {
      return pHVar2;
    }
  }
  bVar1 = network_pimpl::hfdt_exists((this->super_MlmWrap).state,dataName,originModule);
  if (bVar1) {
    network_pimpl::find_hfdt(&local_c0,(this->super_MlmWrap).state,dataName,originModule);
    pHVar2 = MlmWrap::createWorkerSub(&this->super_MlmWrap,&local_c0,1,userFoo,args);
    HighFreqDataType::~HighFreqDataType(&local_c0);
  }
  else {
    pHVar2 = (HFSubWorker *)0x0;
  }
  return pHVar2;
}

Assistant:

HFSubWorker* AbstractModuleClient::subscribeHighFreqData(std::string dataName, std::string originModule, hfs_data_callback_fn userFoo, void *args) {
    if (isHfTypeCurrentlySubbed(dataName, originModule)) { //if the module is already subbed, return the current sub object
        HighFreqSub* sub = getHfSubObject(dataName, originModule);
        if(sub->getSubSockType() == HighFreqSub::ST_WORKER)
            return (HFSubWorker*)sub;
    }

    if (state->hfdt_exists(dataName, originModule)) { //check to make sure the requested type is provided by another module
        return( createWorkerSub( state->find_hfdt(dataName, originModule), 1, userFoo, args ) );
    }
    else {
        // std::cerr << error("The specified type does not exist. Could not create Subscriber\n");
        return(NULL);
    }
}